

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test::testBody
          (TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test
           *this)

{
  size_t sVar1;
  void *mem;
  void *mem_00;
  void *buffer;
  void *buffer_00;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  
  sVar1 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
                     detector,mem_leak_period_all);
  mem = operator_new__(100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                       ,0xeb);
  mem_00 = operator_new(1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                        ,0xec);
  buffer = cpputest_malloc_location_with_leak_detection(10,"file",10);
  buffer_00 = cpputest_realloc_location_with_leak_detection((void *)0x0,10,"file",10);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
                     detector,mem_leak_period_all);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,sVar1,sVar3,
             "LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0xf0,pTVar4);
  cpputest_free_location_with_leak_detection(buffer,"file",10);
  cpputest_free_location_with_leak_detection(buffer_00,"file",10);
  if (mem != (void *)0x0) {
    operator_delete__(mem);
  }
  operator_delete(mem_00,1);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsCausesNoAdditionalLeaks)
{
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* arrayMemory = new char[100];
    char* nonArrayMemory = new char;
    char* mallocMemory = (char*) cpputest_malloc_location_with_leak_detection(10, "file", 10);
    char* reallocMemory = (char*) cpputest_realloc_location_with_leak_detection(NULLPTR, 10, "file", 10);

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    cpputest_free_location_with_leak_detection(mallocMemory, "file", 10);
    cpputest_free_location_with_leak_detection(reallocMemory, "file", 10);
    delete [] arrayMemory;
    delete nonArrayMemory;
}